

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestAllTypes>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:283:29),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:285:10)>
::getImpl(TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestAllTypes>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:283:29),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:285:10)>
          *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  undefined8 local_3d8;
  CapTableReader *pCStack_3d0;
  undefined1 *local_3c8;
  WirePointer *pWStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  Own<capnp::ResponseHook,_std::nullptr_t> local_3a8;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> depResult;
  ExceptionOr<kj::_::Void> local_1b0;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  uVar1 = depResult.value.ptr.field_1.value.hook.ptr;
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    local_3d8 = (SegmentReader *)
                CONCAT44(2,depResult.super_ExceptionOrValue.exception.ptr.field_1.value.type);
    pCStack_3d0 = (CapTableReader *)0x4224f8;
    local_3c8 = &DAT_00000005;
    pWStack_3c0 = (WirePointer *)
                  CONCAT71(pWStack_3c0._1_7_,
                           depResult.super_ExceptionOrValue.exception.ptr.field_1.value.type ==
                           DISCONNECTED);
    if ((depResult.super_ExceptionOrValue.exception.ptr.field_1.value.type != DISCONNECTED) &&
       (Debug::minSeverity < 3)) {
      Debug::log<char_const(&)[66],kj::_::DebugComparison<kj::Exception::Type,kj::Exception::Type>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x11e,ERROR,
                 "\"failed: expected \" \"e.getType() == kj::Exception::Type::DISCONNECTED\", _kjCondition"
                 ,(char (*) [66])"failed: expected e.getType() == kj::Exception::Type::DISCONNECTED"
                 ,(DebugComparison<kj::Exception::Type,_kj::Exception::Type> *)&local_3d8);
    }
    local_1b0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1b0.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1b0);
  }
  else {
    if (depResult.value.ptr.isSet != true) goto LAB_00201c02;
    local_3b8 = depResult.value.ptr.field_1._32_8_;
    uStack_3b0 = depResult.value.ptr.field_1._40_8_;
    local_3c8 = (undefined1 *)depResult.value.ptr.field_1.value.super_Reader._reader.data;
    pWStack_3c0 = depResult.value.ptr.field_1.value.super_Reader._reader.pointers;
    local_3d8 = depResult.value.ptr.field_1.value.super_Reader._reader.segment;
    pCStack_3d0 = depResult.value.ptr.field_1.value.super_Reader._reader.capTable;
    depResult.value.ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
    local_3a8.disposer = depResult.value.ptr.field_1.value.hook.disposer;
    local_3a8.ptr = (ResponseHook *)uVar1;
    if (Debug::minSeverity < 3) {
      Debug::log<char_const(&)[19]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x11c,ERROR,"\"should have thrown\"",(char (*) [19])0x425654);
    }
    Own<capnp::ResponseHook,_std::nullptr_t>::dispose(&local_3a8);
    local_1b0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1b0.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1b0);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_1b0);
LAB_00201c02:
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::~ExceptionOr(&depResult)
  ;
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }